

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9WriteVer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint local_54;
  int fVerbose;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pFileName;
  Abc_Ntk_t *pNtkSpec;
  char *pFileSpec;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtkSpec = (Abc_Ntk_t *)0x0;
  local_54 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Svh");
      if (iVar1 == -1) {
        if (argc - globalUtilOptind == 1) {
          pcVar2 = argv[globalUtilOptind];
          if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"There is no mapped file to write.\n");
            pAbc_local._4_4_ = 1;
          }
          else if (pNtkSpec == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"The specification file is not given.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            FileType = Io_ReadFileType((char *)pNtkSpec);
            pNtk = Io_ReadNetlist((char *)pNtkSpec,FileType,0);
            if (pNtk == (Abc_Ntk_t *)0x0) {
              Abc_Print(-1,"Reading hierarchical Verilog for the specification has failed.\n");
              pAbc_local._4_4_ = 1;
            }
            else {
              Abc_NtkInsertHierarchyGia(pNtk,pAbc->pNtkCur,local_54);
              Io_WriteVerilog(pNtk,pcVar2,0);
              Abc_NtkDelete(pNtk);
              pAbc_local._4_4_ = 0;
            }
          }
        }
        else {
          Abc_Print(-1,"Expecting output file name on the command line.\n");
          pAbc_local._4_4_ = 1;
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 != 0x53) break;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a file name.\n");
        goto LAB_0029e221;
      }
      pNtkSpec = (Abc_Ntk_t *)argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_54 = local_54 ^ 1;
  }
LAB_0029e221:
  Abc_Print(-2,"usage: &write_ver [-S <file>] [-vh] <file>\n");
  Abc_Print(-2,"\t          writes hierarchical Verilog after mapping\n");
  Abc_Print(-2,"\t-S file : file name for the original hierarchical design (required)\n");
  pcVar2 = "no";
  if (local_54 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v      : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  Abc_Print(-2,"\t<file>  : the file name\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9WriteVer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileSpec = NULL;
    Abc_Ntk_t * pNtkSpec = NULL;
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileSpec = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "Expecting output file name on the command line.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( -1, "There is no mapped file to write.\n" );
        return 1;
    }
    if ( pFileSpec == NULL )
    {
        Abc_Print( -1, "The specification file is not given.\n" );
        return 1;
    }
    pNtkSpec = Io_ReadNetlist( pFileSpec, Io_ReadFileType(pFileSpec), 0 );
    if ( pNtkSpec == NULL )
    {
        Abc_Print( -1, "Reading hierarchical Verilog for the specification has failed.\n" );
        return 1;
    }
    Abc_NtkInsertHierarchyGia( pNtkSpec, pAbc->pNtkCur, fVerbose );
    Io_WriteVerilog( pNtkSpec, pFileName, 0 );
    Abc_NtkDelete( pNtkSpec );
    return 0;

usage:
    Abc_Print( -2, "usage: &write_ver [-S <file>] [-vh] <file>\n" );
    Abc_Print( -2, "\t          writes hierarchical Verilog after mapping\n" );
    Abc_Print( -2, "\t-S file : file name for the original hierarchical design (required)\n" );
    Abc_Print( -2, "\t-v      : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : the file name\n");
    return 1;
}